

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

void __thiscall Js::AsmJsModuleCompiler::InitMemoryOffsets(AsmJsModuleCompiler *this)

{
  RegSlot RVar1;
  int iVar2;
  
  (this->mModuleMemory).mArrayBufferOffset = 0;
  (this->mModuleMemory).mStdLibOffset = 1;
  (this->mModuleMemory).mDoubleOffset = 2;
  RVar1 = (this->mIntVarSpace).mRegisterCount;
  iVar2 = ((this->mDoubleVarSpace).mRegisterCount - (this->mDoubleVarSpace).mNbConst) + 2;
  (this->mModuleMemory).mFuncOffset = iVar2;
  iVar2 = iVar2 + (this->mFunctionArray).
                  super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>.count
  ;
  (this->mModuleMemory).mFFIOffset = iVar2;
  iVar2 = ((this->mImportFunctions).mRegisterCount - (this->mImportFunctions).mNbConst) + iVar2;
  (this->mModuleMemory).mFuncPtrOffset = iVar2;
  iVar2 = iVar2 + this->mFuncPtrTableCount;
  (this->mModuleMemory).mFloatOffset = iVar2;
  iVar2 = (int)((double)((this->mFloatVarSpace).mRegisterCount - (this->mFloatVarSpace).mNbConst) *
                0.5 + 0.5) + iVar2;
  (this->mModuleMemory).mIntOffset = iVar2;
  (this->mModuleMemory).mMemorySize =
       (int)((double)(RVar1 - (this->mIntVarSpace).mNbConst) * 0.5 + 0.5) + iVar2;
  return;
}

Assistant:

void AsmJsModuleCompiler::InitMemoryOffsets()
    {
        mModuleMemory.mArrayBufferOffset = AsmJsModuleMemory::MemoryTableBeginOffset;
        mModuleMemory.mStdLibOffset = mModuleMemory.mArrayBufferOffset + 1;
        mModuleMemory.mDoubleOffset = mModuleMemory.mStdLibOffset + 1;
        mModuleMemory.mFuncOffset = mModuleMemory.mDoubleOffset + (mDoubleVarSpace.GetTotalVarCount() * WAsmJs::DOUBLE_SLOTS_SPACE);
        mModuleMemory.mFFIOffset = mModuleMemory.mFuncOffset + mFunctionArray.Count();
        mModuleMemory.mFuncPtrOffset = mModuleMemory.mFFIOffset + mImportFunctions.GetTotalVarCount();
        mModuleMemory.mFloatOffset = mModuleMemory.mFuncPtrOffset + GetFuncPtrTableCount();
        mModuleMemory.mIntOffset = mModuleMemory.mFloatOffset + (int32)(mFloatVarSpace.GetTotalVarCount() * WAsmJs::FLOAT_SLOTS_SPACE + 0.5);
        mModuleMemory.mMemorySize = mModuleMemory.mIntOffset + (int32)(mIntVarSpace.GetTotalVarCount() * WAsmJs::INT_SLOTS_SPACE + 0.5);
    }